

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobProto::MergeFrom(BlobProto *this,BlobProto *from)

{
  uint uVar1;
  LogMessage *other;
  BlobShape *this_00;
  BlobShape *from_00;
  InternalMetadataWithArena *this_01;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  BlobProto *local_78;
  BlobProto *from_local;
  BlobProto *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xef3);
    local_b1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (BlobProto *)&local_78->_internal_metadata_;
  local_60 = this_01;
  local_58 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_01,&local_28->unknown_fields);
  }
  google::protobuf::RepeatedField<float>::MergeFrom(&this->data_,&local_78->data_);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->diff_,&local_78->diff_);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->double_data_,&local_78->double_data_);
  google::protobuf::RepeatedField<double>::MergeFrom(&this->double_diff_,&local_78->double_diff_);
  local_38 = &local_78->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = mutable_shape(this);
      from_00 = shape(local_78);
      BlobShape::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 2) != 0) {
      this->num_ = local_78->num_;
    }
    if ((uVar1 & 4) != 0) {
      this->channels_ = local_78->channels_;
    }
    if ((uVar1 & 8) != 0) {
      this->height_ = local_78->height_;
    }
    if ((uVar1 & 0x10) != 0) {
      this->width_ = local_78->width_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void BlobProto::MergeFrom(const BlobProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.BlobProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  data_.MergeFrom(from.data_);
  diff_.MergeFrom(from.diff_);
  double_data_.MergeFrom(from.double_data_);
  double_diff_.MergeFrom(from.double_diff_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 31u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_shape()->::caffe::BlobShape::MergeFrom(from.shape());
    }
    if (cached_has_bits & 0x00000002u) {
      num_ = from.num_;
    }
    if (cached_has_bits & 0x00000004u) {
      channels_ = from.channels_;
    }
    if (cached_has_bits & 0x00000008u) {
      height_ = from.height_;
    }
    if (cached_has_bits & 0x00000010u) {
      width_ = from.width_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}